

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::record_graphics_pipeline
          (StateRecorder *this,VkPipeline pipeline,VkGraphicsPipelineCreateInfo *create_info,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,Hash custom_hash,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  int *piVar6;
  VkPipelineShaderStageCreateInfo *pVVar7;
  Impl *pIVar8;
  VkGraphicsPipelineCreateInfo *new_info;
  WorkItem local_50;
  mutex *__mutex;
  
  piVar6 = (int *)create_info->pNext;
  piVar4 = piVar6;
  if (piVar6 != (int *)0x0) {
    do {
      if (*piVar4 == 0x3ba228ba) {
        if (piVar4[4] != 0) {
          return true;
        }
        break;
      }
      piVar1 = piVar4 + 2;
      piVar4 = *(int **)piVar1;
    } while (*(int **)piVar1 != (int *)0x0);
    do {
      if (*piVar6 == 0x3b9fac02) {
        if (((create_info->flags >> 0xb & 1) != 0) && ((*(byte *)(piVar6 + 4) & 6) == 0)) {
          pIVar8 = this->impl;
          goto LAB_0012f083;
        }
        break;
      }
      piVar6 = *(int **)(piVar6 + 2);
    } while (piVar6 != (int *)0x0);
  }
  pIVar8 = this->impl;
  if ((ulong)create_info->stageCount != 0) {
    uVar5 = 0;
    do {
      if (create_info->pStages[uVar5].module == (VkShaderModule)0x0) {
        pVVar7 = create_info->pStages + uVar5;
        do {
          pVVar7 = (VkPipelineShaderStageCreateInfo *)pVVar7->pNext;
          if (pVVar7 == (VkPipelineShaderStageCreateInfo *)0x0) {
            if (pIVar8->should_record_identifier_only == false) {
              iVar3 = pthread_mutex_lock((pthread_mutex_t *)&pIVar8->record_lock);
              if (iVar3 != 0) goto LAB_0012f183;
              if (pipeline != (VkPipeline)0x0) {
                Impl::push_unregister_locked<VkPipeline_T*>
                          (this->impl,VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,pipeline);
              }
              pthread_mutex_unlock((pthread_mutex_t *)&pIVar8->record_lock);
              goto LAB_0012f15f;
            }
            break;
          }
        } while (pVVar7->sType != VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != create_info->stageCount);
  }
LAB_0012f083:
  __mutex = &pIVar8->record_lock;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
LAB_0012f183:
    std::__throw_system_error(iVar3);
  }
  new_info = (VkGraphicsPipelineCreateInfo *)0x0;
  bVar2 = Impl::copy_graphics_pipeline
                    (this->impl,create_info,&this->impl->temp_allocator,base_pipelines,
                     base_pipeline_count,device,gsmcii,&new_info);
  if (bVar2) {
    local_50.type = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
    local_50.create_info = new_info;
    local_50.handle = (uint64_t)pipeline;
    local_50.custom_hash = custom_hash;
    Impl::push_work_locked(this->impl,&local_50);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    Impl::pump_synchronized_recording(this->impl,this);
LAB_0012f15f:
    bVar2 = true;
  }
  else {
    if (pipeline != (VkPipeline)0x0) {
      Impl::push_unregister_locked<VkPipeline_T*>
                (this->impl,VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,pipeline);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool StateRecorder::record_graphics_pipeline(VkPipeline pipeline, const VkGraphicsPipelineCreateInfo &create_info,
                                             const VkPipeline *base_pipelines, uint32_t base_pipeline_count,
                                             Hash custom_hash,
                                             VkDevice device,
                                             PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)
{
	// Silently ignore if we have pipeline binaries.
	// We have no way of recording these unless we go the extra mile to
	// override the global key and add extra metadata blocks.
	// Hopefully applications are well-behaved ...
	auto *binaries = find_pnext<VkPipelineBinaryInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_BINARY_INFO_KHR, create_info.pNext);
	if (binaries && binaries->binaryCount)
		return true;

	// Ignore pipelines that cannot result in meaningful replay.
	// We are not allowed to look at pStages unless we're emitting pre-raster / fragment shader interface.
	// If we are using module identifier data + on use, we need to push it for record.
	auto state_flags = graphics_pipeline_get_effective_state_flags(create_info);
	if (graphics_pipeline_library_state_flags_have_module_state(state_flags))
	{
		for (uint32_t i = 0; i < create_info.stageCount; i++)
		{
			if (shader_stage_is_identifier_only(create_info.pStages[i]) &&
			    !impl->should_record_identifier_only)
			{
				// Have to forget any reference if this API handle is recycled.
				std::lock_guard<std::mutex> lock(impl->record_lock);
				if (pipeline != VK_NULL_HANDLE)
					impl->push_unregister_locked(VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO, pipeline);
				return true;
			}
		}
	}

	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		VkGraphicsPipelineCreateInfo *new_info = nullptr;
		if (!impl->copy_graphics_pipeline(&create_info, impl->temp_allocator,
		                                  base_pipelines, base_pipeline_count,
		                                  device, gsmcii,
		                                  &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			if (pipeline != VK_NULL_HANDLE)
				impl->push_unregister_locked(VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO, pipeline);
			return false;
		}

		impl->push_work_locked({VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO, api_object_cast<uint64_t>(pipeline),
		                        new_info, custom_hash});
	}

	impl->pump_synchronized_recording(this);
	return true;
}